

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_device.c
# Opt level: O0

MPP_RET mpp_dev_deinit(MppDev ctx)

{
  MPP_RET local_24;
  MPP_RET ret;
  MppDevImpl *p;
  MppDev ctx_local;
  
  if (ctx == (MppDev)0x0) {
    _mpp_log_l(2,"mpp_device","found NULL input ctx\n","mpp_dev_deinit");
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    local_24 = MPP_OK;
    if (((*(long *)((long)ctx + 0x10) != 0) && (*(long *)(*(long *)((long)ctx + 0x10) + 0x18) != 0))
       && (*(long *)((long)ctx + 8) != 0)) {
      local_24 = (**(code **)(*(long *)((long)ctx + 0x10) + 0x18))(*(undefined8 *)((long)ctx + 8));
    }
    if (*(long *)((long)ctx + 8) != 0) {
      mpp_osal_free("mpp_dev_deinit",*(void **)((long)ctx + 8));
    }
    *(undefined8 *)((long)ctx + 8) = 0;
    if (ctx != (MppDev)0x0) {
      mpp_osal_free("mpp_dev_deinit",ctx);
    }
    ctx_local._4_4_ = local_24;
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET mpp_dev_deinit(MppDev ctx)
{
    if (NULL == ctx) {
        mpp_err_f("found NULL input ctx\n");
        return MPP_ERR_NULL_PTR;
    }

    MppDevImpl *p = (MppDevImpl *)ctx;
    MPP_RET ret = MPP_OK;

    if (p->api && p->api->deinit && p->ctx)
        ret = p->api->deinit(p->ctx);

    MPP_FREE(p->ctx);
    MPP_FREE(p);

    return ret;
}